

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O0

uint32_t cfd::api::HDWalletApi::GetExtkeyVersion(ExtKeyType key_type,NetType net_type)

{
  uint32_t version;
  NetType net_type_local;
  ExtKeyType key_type_local;
  
  if (key_type == kExtPrivkey) {
    version = 0x4358394;
    if ((net_type == kMainnet) || (net_type == kLiquidV1)) {
      version = 0x488ade4;
    }
  }
  else {
    version = 0x43587cf;
    if ((net_type == kMainnet) || (net_type == kLiquidV1)) {
      version = 0x488b21e;
    }
  }
  return version;
}

Assistant:

uint32_t HDWalletApi::GetExtkeyVersion(ExtKeyType key_type, NetType net_type) {
  uint32_t version;
  if (key_type == ExtKeyType::kExtPrivkey) {
    version = ExtPrivkey::kVersionTestnetPrivkey;
    if ((net_type == NetType::kMainnet) || (net_type == NetType::kLiquidV1)) {
      version = ExtPrivkey::kVersionMainnetPrivkey;
    }
  } else {
    version = ExtPubkey::kVersionTestnetPubkey;
    if ((net_type == NetType::kMainnet) || (net_type == NetType::kLiquidV1)) {
      version = ExtPubkey::kVersionMainnetPubkey;
    }
  }
  return version;
}